

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

uint64_t helper_float_cvt_2008_l_s_mipsel(CPUMIPSState_conflict4 *env,uint32_t fst0)

{
  byte bVar1;
  uint uVar2;
  uint64_t uVar3;
  uint uVar4;
  uint64_t uVar5;
  uint uVar6;
  uintptr_t unaff_retaddr;
  
  uVar3 = float32_to_int64_mipsel(fst0,&(env->active_fpu).fp_status);
  bVar1 = (env->active_fpu).fp_status.float_exception_flags;
  if (bVar1 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = bVar1 >> 5 & 1 | (bVar1 >> 3 & 2 | bVar1 >> 1 & 4 | (bVar1 & 1) << 4) + (bVar1 & 4) * 2;
  }
  uVar2 = (env->active_fpu).fcr31;
  uVar6 = uVar4 << 0xc | uVar2 & 0xfffc0fff;
  (env->active_fpu).fcr31 = uVar6;
  if (uVar4 != 0) {
    (env->active_fpu).fp_status.float_exception_flags = '\0';
    if ((uVar4 & uVar2 >> 7) != 0) {
      do_raise_exception(env,0x17,unaff_retaddr);
    }
    (env->active_fpu).fcr31 = uVar6 | uVar4 << 2;
  }
  uVar5 = 0;
  if ((fst0 & 0x7fffffff) < 0x7f800001) {
    uVar5 = uVar3;
  }
  if ((bVar1 & 1) == 0) {
    uVar5 = uVar3;
  }
  return uVar5;
}

Assistant:

uint64_t helper_float_cvt_2008_l_s(CPUMIPSState *env, uint32_t fst0)
{
    uint64_t dt2;

    dt2 = float32_to_int64(fst0, &env->active_fpu.fp_status);
    if (get_float_exception_flags(&env->active_fpu.fp_status)
            & float_flag_invalid) {
        if (float32_is_any_nan(fst0)) {
            dt2 = 0;
        }
    }
    update_fcr31(env, GETPC());
    return dt2;
}